

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv.h
# Opt level: O2

void integer_mv_precision(MV *mv)

{
  ushort uVar1;
  short sVar2;
  ushort uVar3;
  
  uVar3 = mv->row % 8;
  if (uVar3 != 0) {
    sVar2 = mv->row - uVar3;
    mv->row = sVar2;
    uVar1 = -uVar3;
    if (0 < (short)uVar3) {
      uVar1 = uVar3;
    }
    if (4 < uVar1) {
      mv->row = (ushort)(0 < (short)uVar3) * 0x10 + sVar2 + -8;
    }
  }
  uVar3 = mv->col % 8;
  if (uVar3 != 0) {
    sVar2 = mv->col - uVar3;
    mv->col = sVar2;
    uVar1 = -uVar3;
    if (0 < (short)uVar3) {
      uVar1 = uVar3;
    }
    if (4 < uVar1) {
      mv->col = (ushort)(0 < (short)uVar3) * 0x10 + sVar2 + -8;
    }
  }
  return;
}

Assistant:

static inline void integer_mv_precision(MV *mv) {
  int mod = (mv->row % 8);
  if (mod != 0) {
    mv->row -= mod;
    if (abs(mod) > 4) {
      if (mod > 0) {
        mv->row += 8;
      } else {
        mv->row -= 8;
      }
    }
  }

  mod = (mv->col % 8);
  if (mod != 0) {
    mv->col -= mod;
    if (abs(mod) > 4) {
      if (mod > 0) {
        mv->col += 8;
      } else {
        mv->col -= 8;
      }
    }
  }
}